

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::i64_Trunc_f32s(w3Interp *this)

{
  float *pfVar1;
  
  pfVar1 = w3Stack::f32(&this->super_w3Stack);
  w3Stack::set_i64(&this->super_w3Stack,(long)*pfVar1);
  return;
}

Assistant:

INTERP (i64_Trunc_f32s)
{
    set_i64 ((int64_t)f32 ());
}